

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

void __thiscall
testing::internal::FunctionMocker<void_(int,_int)>::PerformAction
          (FunctionMocker<void_(int,_int)> *this,void *untyped_action,ArgumentTuple *args,
          string *call_description)

{
  tuple<int,_int> local_50;
  undefined1 local_48 [8];
  Action<void_(int,_int)> action;
  string *call_description_local;
  ArgumentTuple *args_local;
  void *untyped_action_local;
  FunctionMocker<void_(int,_int)> *this_local;
  
  action.fun_._M_invoker = (_Invoker_type)call_description;
  if (untyped_action == (void *)0x0) {
    PerformDefaultAction(this,args,call_description);
  }
  else {
    Action<void_(int,_int)>::Action
              ((Action<void_(int,_int)> *)local_48,(Action<void_(int,_int)> *)untyped_action);
    std::tuple<int,_int>::tuple(&local_50,args);
    Action<void_(int,_int)>::Perform((Action<void_(int,_int)> *)local_48,&local_50);
    Action<void_(int,_int)>::~Action((Action<void_(int,_int)> *)local_48);
  }
  return;
}

Assistant:

R PerformAction(const void* untyped_action, ArgumentTuple&& args,
                  const std::string& call_description) const {
    if (untyped_action == nullptr) {
      return PerformDefaultAction(std::move(args), call_description);
    }

    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    return action.Perform(std::move(args));
  }